

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O3

void __thiscall
Potassco::ProgramOptions::ParsedValues::add(ParsedValues *this,SharedOptPtr *opt,string *value)

{
  pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_38;
  
  std::
  pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&pStack_38,opt,value);
  std::
  vector<std::pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,std::__cxx11::string>,std::allocator<std::pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,std::__cxx11::string>>>
  ::
  emplace_back<std::pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,std::__cxx11::string>>
            ((vector<std::pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,std::__cxx11::string>,std::allocator<std::pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,std::__cxx11::string>>>
              *)&this->parsed_,&pStack_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_38.second._M_dataplus._M_p != &pStack_38.second.field_2) {
    operator_delete(pStack_38.second._M_dataplus._M_p);
  }
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&pStack_38.first);
  return;
}

Assistant:

void add(const SharedOptPtr& opt, const std::string& value) {
		parsed_.push_back(OptionAndValue(opt, value));
	}